

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_demo.cpp
# Opt level: O2

void __thiscall despot::RegDemo::ComputeDefaultActions(RegDemo *this,string *type)

{
  long lVar1;
  pointer piVar2;
  bool bVar3;
  uint uVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  
  poVar5 = std::operator<<((ostream *)&std::cerr,"Default action = ");
  poVar5 = std::operator<<(poVar5,(string *)type);
  std::endl<char,std::char_traits<char>>(poVar5);
  bVar3 = std::operator==(type,"MDP");
  if (bVar3) {
    (**(code **)(*(long *)&this->super_MDP + 0x30))(&this->super_MDP);
    uVar4 = (**(code **)(*(long *)this + 0xd0))(this);
    std::vector<int,_std::allocator<int>_>::resize(&this->default_action_,(long)(int)uVar4);
    lVar1 = *(long *)&this->field_0x10;
    piVar2 = (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = 0;
    uVar7 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar7 = uVar6;
    }
    for (; uVar7 * 4 != uVar6; uVar6 = uVar6 + 4) {
      *(undefined4 *)((long)piVar2 + uVar6) = *(undefined4 *)(lVar1 + uVar6 * 4);
    }
    return;
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"Unsupported default action type ");
  poVar5 = std::operator<<(poVar5,(string *)type);
  std::endl<char,std::char_traits<char>>(poVar5);
  exit(0);
}

Assistant:

void RegDemo::ComputeDefaultActions(string type) const {
	cerr << "Default action = " << type << endl;
	if (type == "MDP") {
		const_cast<RegDemo*>(this)->ComputeOptimalPolicyUsingVI();
		int num_states = NumStates();
		default_action_.resize(num_states);

		double value = 0;
		for (int s = 0; s < num_states; s++) {
			default_action_[s] = policy_[s].action;
			value += policy_[s].value;
		}
	} else {
		cerr << "Unsupported default action type " << type << endl;
		exit(0);
	}
}